

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Parser_Exe.H
# Opt level: O0

void amrex::parser_compile(amrex_parser *parser,char *p)

{
  ParserExeNull *in_RSI;
  Vector<char_*,_std::allocator<char_*>_> local_variables;
  int stack_size;
  int max_stack_size;
  size_t exe_size;
  Vector<char_*,_std::allocator<char_*>_> *in_stack_000007c8;
  int *in_stack_000007d0;
  int *in_stack_000007d8;
  size_t *in_stack_000007e0;
  char **in_stack_000007e8;
  parser_node *in_stack_000007f0;
  
  Vector<char_*,_std::allocator<char_*>_>::Vector
            ((Vector<char_*,_std::allocator<char_*>_> *)0x1483766);
  parser_compile_exe_size
            (in_stack_000007f0,in_stack_000007e8,in_stack_000007e0,in_stack_000007d8,
             in_stack_000007d0,in_stack_000007c8);
  ParserExeNull::ParserExeNull(in_RSI);
  Vector<char_*,_std::allocator<char_*>_>::~Vector
            ((Vector<char_*,_std::allocator<char_*>_> *)0x14837a3);
  return;
}

Assistant:

inline void
parser_compile (struct amrex_parser* parser, char* p)
{
    std::size_t exe_size = 0;
    int max_stack_size = 0;
    int stack_size = 0;
    Vector<char*> local_variables;
    parser_compile_exe_size(parser->ast, p, exe_size, max_stack_size, stack_size, local_variables);
    new(p) ParserExeNull;
}